

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O3

int EVP_HPKE_CTX_setup_sender_with_seed_for_testing
              (EVP_HPKE_CTX *ctx,uint8_t *out_enc,size_t *out_enc_len,size_t max_enc,
              EVP_HPKE_KEM *kem,EVP_HPKE_KDF *kdf,EVP_HPKE_AEAD *aead,uint8_t *peer_public_key,
              size_t peer_public_key_len,uint8_t *info,size_t info_len,uint8_t *seed,size_t seed_len
              )

{
  int iVar1;
  size_t local_60;
  uint8_t local_58 [40];
  
  memset(ctx,0,0x2c8);
  EVP_AEAD_CTX_zero(&ctx->aead_ctx);
  ctx->is_sender = 1;
  ctx->kem = kem;
  ctx->kdf = kdf;
  ctx->aead = aead;
  iVar1 = (*kem->encap_with_seed)
                    (kem,local_58,&local_60,out_enc,out_enc_len,max_enc,peer_public_key,
                     peer_public_key_len,seed,seed_len);
  if ((iVar1 != 0) &&
     (iVar1 = hpke_key_schedule(ctx,'\0',local_58,local_60,info,info_len), iVar1 != 0)) {
    return 1;
  }
  EVP_AEAD_CTX_cleanup(&ctx->aead_ctx);
  return 0;
}

Assistant:

int EVP_HPKE_CTX_setup_sender_with_seed_for_testing(
    EVP_HPKE_CTX *ctx, uint8_t *out_enc, size_t *out_enc_len, size_t max_enc,
    const EVP_HPKE_KEM *kem, const EVP_HPKE_KDF *kdf, const EVP_HPKE_AEAD *aead,
    const uint8_t *peer_public_key, size_t peer_public_key_len,
    const uint8_t *info, size_t info_len, const uint8_t *seed,
    size_t seed_len) {
  EVP_HPKE_CTX_zero(ctx);
  ctx->is_sender = 1;
  ctx->kem = kem;
  ctx->kdf = kdf;
  ctx->aead = aead;
  uint8_t shared_secret[MAX_SHARED_SECRET_LEN];
  size_t shared_secret_len;
  if (!kem->encap_with_seed(kem, shared_secret, &shared_secret_len, out_enc,
                            out_enc_len, max_enc, peer_public_key,
                            peer_public_key_len, seed, seed_len) ||
      !hpke_key_schedule(ctx, HPKE_MODE_BASE, shared_secret, shared_secret_len,
                         info, info_len)) {
    EVP_HPKE_CTX_cleanup(ctx);
    return 0;
  }
  return 1;
}